

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdopt.c
# Opt level: O0

void collect_single_states(MACROBLOCK *x,InterModeSearchState *search_state,MB_MODE_INFO *mbmi)

{
  char cVar1;
  byte bVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  long *plVar8;
  long lVar9;
  undefined8 *puVar10;
  undefined8 *puVar11;
  long in_RDX;
  long in_RSI;
  SingleInterModeState *state_m;
  SingleInterModeState this_state_m;
  int64_t rd_1;
  int ref_mv_idx_1;
  int64_t modelled_rd;
  SingleInterModeState *state_s;
  SingleInterModeState this_state_s;
  int64_t rd;
  int ref_mv_idx;
  int64_t simple_rd;
  int ref_set;
  int mode_offset;
  int dir;
  PREDICTION_MODE this_mode;
  MV_REFERENCE_FRAME ref_frame;
  int j;
  int i;
  undefined4 local_80;
  undefined4 in_stack_ffffffffffffff94;
  int iVar12;
  MV_REFERENCE_FRAME *in_stack_ffffffffffffff98;
  MACROBLOCK *in_stack_ffffffffffffffa0;
  undefined4 local_50;
  int local_3c;
  long local_38;
  int local_20;
  
  cVar1 = *(char *)(in_RDX + 0x10);
  bVar2 = *(byte *)(in_RDX + 2);
  uVar4 = (uint)('\x04' < cVar1);
  iVar5 = bVar2 - 0xd;
  iVar6 = get_drl_refmv_count(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
                              (PREDICTION_MODE)((uint)in_stack_ffffffffffffff94 >> 0x18));
  local_38 = *(long *)(in_RSI + 0x1a90 + (ulong)bVar2 * 0xc0 + (long)cVar1 * 8);
  for (local_3c = 1; local_3c < iVar6; local_3c = local_3c + 1) {
    lVar7 = *(long *)(in_RSI + 0x1a90 + (ulong)bVar2 * 0xc0 + (long)local_3c * 0x40 +
                     (long)cVar1 * 8);
    if (lVar7 < local_38) {
      local_38 = lVar7;
    }
  }
  local_50 = CONCAT31(local_50._1_3_,cVar1);
  lVar7 = in_RSI + 0x2d98 + (long)(int)uVar4 * 0x100 + (long)iVar5 * 0x40;
  local_20 = *(int *)(in_RSI + 0x2f98 + (long)(int)uVar4 * 0x10 + (long)iVar5 * 4);
  while( true ) {
    bVar3 = false;
    if (0 < local_20) {
      bVar3 = local_38 < *(long *)(lVar7 + (long)(local_20 + -1) * 0x10);
    }
    if (!bVar3) break;
    puVar10 = (undefined8 *)(lVar7 + (long)local_20 * 0x10);
    puVar11 = (undefined8 *)(lVar7 + (long)(local_20 + -1) * 0x10);
    *puVar10 = *puVar11;
    puVar10[1] = puVar11[1];
    local_20 = local_20 + -1;
  }
  plVar8 = (long *)(lVar7 + (long)local_20 * 0x10);
  *plVar8 = local_38;
  plVar8[1] = CONCAT44(1,local_50);
  lVar7 = in_RSI + 0x2f98 + (long)(int)uVar4 * 0x10;
  *(int *)(lVar7 + (long)iVar5 * 4) = *(int *)(lVar7 + (long)iVar5 * 4) + 1;
  lVar7 = *(long *)(in_RSI + 2000 + (ulong)bVar2 * 0xc0 + (long)cVar1 * 8);
  for (iVar12 = 1; iVar12 < iVar6; iVar12 = iVar12 + 1) {
    lVar9 = *(long *)(in_RSI + 2000 + (ulong)bVar2 * 0xc0 + (long)iVar12 * 0x40 + (long)cVar1 * 8);
    if (lVar9 < lVar7) {
      lVar7 = lVar9;
    }
  }
  local_80 = CONCAT31(local_80._1_3_,cVar1);
  lVar9 = in_RSI + 0x2fb8 + (long)(int)uVar4 * 0x100 + (long)iVar5 * 0x40;
  local_20 = *(int *)(in_RSI + 0x31b8 + (long)(int)uVar4 * 0x10 + (long)iVar5 * 4);
  while( true ) {
    bVar3 = false;
    if (0 < local_20) {
      bVar3 = lVar7 < *(long *)(lVar9 + (long)(local_20 + -1) * 0x10);
    }
    if (!bVar3) break;
    puVar10 = (undefined8 *)(lVar9 + (long)local_20 * 0x10);
    puVar11 = (undefined8 *)(lVar9 + (long)(local_20 + -1) * 0x10);
    *puVar10 = *puVar11;
    puVar10[1] = puVar11[1];
    local_20 = local_20 + -1;
  }
  plVar8 = (long *)(lVar9 + (long)local_20 * 0x10);
  *plVar8 = lVar7;
  plVar8[1] = CONCAT44(1,local_80);
  lVar7 = in_RSI + 0x31b8 + (long)(int)uVar4 * 0x10;
  *(int *)(lVar7 + (long)iVar5 * 4) = *(int *)(lVar7 + (long)iVar5 * 4) + 1;
  return;
}

Assistant:

static inline void collect_single_states(MACROBLOCK *x,
                                         InterModeSearchState *search_state,
                                         const MB_MODE_INFO *const mbmi) {
  int i, j;
  const MV_REFERENCE_FRAME ref_frame = mbmi->ref_frame[0];
  const PREDICTION_MODE this_mode = mbmi->mode;
  const int dir = ref_frame <= GOLDEN_FRAME ? 0 : 1;
  const int mode_offset = INTER_OFFSET(this_mode);
  const int ref_set = get_drl_refmv_count(x, mbmi->ref_frame, this_mode);

  // Simple rd
  int64_t simple_rd = search_state->simple_rd[this_mode][0][ref_frame];
  for (int ref_mv_idx = 1; ref_mv_idx < ref_set; ++ref_mv_idx) {
    const int64_t rd =
        search_state->simple_rd[this_mode][ref_mv_idx][ref_frame];
    if (rd < simple_rd) simple_rd = rd;
  }

  // Insertion sort of single_state
  const SingleInterModeState this_state_s = { simple_rd, ref_frame, 1 };
  SingleInterModeState *state_s = search_state->single_state[dir][mode_offset];
  i = search_state->single_state_cnt[dir][mode_offset];
  for (j = i; j > 0 && state_s[j - 1].rd > this_state_s.rd; --j)
    state_s[j] = state_s[j - 1];
  state_s[j] = this_state_s;
  search_state->single_state_cnt[dir][mode_offset]++;

  // Modelled rd
  int64_t modelled_rd = search_state->modelled_rd[this_mode][0][ref_frame];
  for (int ref_mv_idx = 1; ref_mv_idx < ref_set; ++ref_mv_idx) {
    const int64_t rd =
        search_state->modelled_rd[this_mode][ref_mv_idx][ref_frame];
    if (rd < modelled_rd) modelled_rd = rd;
  }

  // Insertion sort of single_state_modelled
  const SingleInterModeState this_state_m = { modelled_rd, ref_frame, 1 };
  SingleInterModeState *state_m =
      search_state->single_state_modelled[dir][mode_offset];
  i = search_state->single_state_modelled_cnt[dir][mode_offset];
  for (j = i; j > 0 && state_m[j - 1].rd > this_state_m.rd; --j)
    state_m[j] = state_m[j - 1];
  state_m[j] = this_state_m;
  search_state->single_state_modelled_cnt[dir][mode_offset]++;
}